

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_tess_level_input_to_interface_block
          (CompilerMSL *this,string *ib_var_ref,SPIRType *ib_type,SPIRVariable *var)

{
  bool bVar1;
  BuiltIn BVar2;
  uint32_t id;
  uint32_t id_00;
  SPIRType *pSVar3;
  uint32_t ib_mbr_idx;
  BuiltIn builtin;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_a8;
  string *local_a0;
  string mbr_name;
  anon_class_40_5_c1147381 mark_locations;
  TypedID<(spirv_cross::Types)1> local_50 [8];
  
  local_a0 = ib_var_ref;
  pSVar3 = Compiler::get_variable_element_type((Compiler *)this,var);
  BVar2 = Compiler::get_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  builtin = BVar2;
  bVar1 = Compiler::is_tessellating_triangles((Compiler *)this);
  mbr_name._M_dataplus._M_p = (pointer)&mbr_name.field_2;
  mbr_name._M_string_length = 0;
  mbr_name.field_2._M_local_buf[0] = '\0';
  local_a8 = &ib_type->member_types;
  ib_mbr_idx = (uint32_t)
               (ib_type->member_types).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
  mark_locations.ib_mbr_idx = &ib_mbr_idx;
  mark_locations.this = this;
  mark_locations.var = var;
  mark_locations.ib_type = ib_type;
  mark_locations.builtin = &builtin;
  if (bVar1) {
    ::std::__cxx11::string::assign((char *)&mbr_name);
    if (this->added_builtin_tess_level == false) {
      local_50[0].id = build_extended_vector_type(this,(pSVar3->super_IVariant).self.id,4,Unknown);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back(local_a8,local_50);
      Compiler::set_member_name
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,ib_mbr_idx,&mbr_name);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,ib_mbr_idx,
                 DecorationBuiltIn,builtin);
      add_tess_level_input_to_interface_block::anon_class_40_5_c1147381::operator()
                (&mark_locations,pSVar3);
      this->added_builtin_tess_level = true;
    }
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(local_50,this,(ulong)BVar2);
    ::std::__cxx11::string::operator=((string *)&mbr_name,(string *)local_50);
    ::std::__cxx11::string::~string((string *)local_50);
    id = build_extended_vector_type
                   (this,(pSVar3->super_IVariant).self.id,
                    (uint)(builtin == BuiltInTessLevelOuter) * 2 + 2,Unknown);
    id_00 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
    pSVar3 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                       ((Compiler *)this,id_00,pSVar3);
    pSVar3->pointer = true;
    pSVar3->pointer_depth = pSVar3->pointer_depth + 1;
    pSVar3->storage = StorageClassInput;
    (pSVar3->parent_type).id = id;
    local_50[0].id = id;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back(local_a8,local_50);
    Compiler::set_member_name
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,ib_mbr_idx,&mbr_name);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,ib_mbr_idx,
               DecorationBuiltIn,builtin);
    add_tess_level_input_to_interface_block::anon_class_40_5_c1147381::operator()
              (&mark_locations,pSVar3);
  }
  add_tess_level_input(this,local_a0,&mbr_name,var);
  ::std::__cxx11::string::~string((string *)&mbr_name);
  return;
}

Assistant:

void CompilerMSL::add_tess_level_input_to_interface_block(const std::string &ib_var_ref, SPIRType &ib_type,
                                                          SPIRVariable &var)
{
	auto &var_type = get_variable_element_type(var);

	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool triangles = is_tessellating_triangles();
	string mbr_name;

	// Add a reference to the variable type to the interface struct.
	uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());

	const auto mark_locations = [&](const SPIRType &new_var_type) {
		if (get_decoration_bitset(var.self).get(DecorationLocation))
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, new_var_type, StorageClassInput);
		}
		else if (inputs_by_builtin.count(builtin))
		{
			uint32_t locn = inputs_by_builtin[builtin].location;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, new_var_type, StorageClassInput);
		}
	};

	if (triangles)
	{
		// Triangles are tricky, because we want only one member in the struct.
		mbr_name = "gl_TessLevel";

		// If we already added the other one, we can skip this step.
		if (!added_builtin_tess_level)
		{
			uint32_t type_id = build_extended_vector_type(var_type.self, 4);

			ib_type.member_types.push_back(type_id);

			// Give the member a name
			set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

			// We cannot decorate both, but the important part is that
			// it's marked as builtin so we can get automatic attribute assignment if needed.
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);

			mark_locations(var_type);
			added_builtin_tess_level = true;
		}
	}
	else
	{
		mbr_name = builtin_to_glsl(builtin, StorageClassFunction);

		uint32_t type_id = build_extended_vector_type(var_type.self, builtin == BuiltInTessLevelOuter ? 4 : 2);

		uint32_t ptr_type_id = ir.increase_bound_by(1);
		auto &new_var_type = set<SPIRType>(ptr_type_id, get<SPIRType>(type_id));
		new_var_type.pointer = true;
		new_var_type.pointer_depth++;
		new_var_type.storage = StorageClassInput;
		new_var_type.parent_type = type_id;

		ib_type.member_types.push_back(type_id);

		// Give the member a name
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);

		mark_locations(new_var_type);
	}

	add_tess_level_input(ib_var_ref, mbr_name, var);
}